

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dto.h
# Opt level: O2

ostream * operator<<(ostream *os,Complex *m)

{
  ostream *poVar1;
  string local_60;
  char *local_40 [2];
  char local_30 [16];
  
  poVar1 = std::operator<<(os,"Complex{cmd=\'");
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,m,&(m->header).cmd_seq);
  poVar1 = std::operator<<(poVar1,local_40[0]);
  poVar1 = std::operator<<(poVar1,"\', cmd_seq=");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", param=");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,", payload=\'");
  dto::pretty_payload(&local_60,&m->payload);
  poVar1 = std::operator<<(poVar1,(string *)&local_60);
  poVar1 = std::operator<<(poVar1,"\'}");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)local_40);
  return poVar1;
}

Assistant:

inline std::ostream &operator<<(std::ostream &os, const dto::Complex &m) {
  return os << "Complex{cmd='" << std::string(m.header.cmd, dto::CMD_TYPE_LEN).c_str() << "', cmd_seq=" << m.header.cmd_seq
            << ", param=" << m.header.param
            << ", payload='"
            << dto::pretty_payload(m.payload) << "'}";
}